

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O1

size_t u16CLZ_fast(u16 w)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined2 in_register_0000003a;
  uint uVar5;
  
  uVar5 = CONCAT22(in_register_0000003a,w);
  uVar1 = uVar5 >> 8;
  if (uVar5 < 0x100) {
    uVar1 = uVar5;
  }
  uVar3 = (ulong)(uVar5 < 0x100) * 8;
  uVar4 = uVar3 | 4;
  uVar5 = uVar1 >> 4;
  if ((ushort)uVar1 < 0x10) {
    uVar4 = uVar3 + 8;
    uVar5 = uVar1;
  }
  uVar3 = uVar4 - 2;
  uVar1 = uVar5 >> 2;
  if ((ushort)uVar5 < 4) {
    uVar3 = uVar4;
    uVar1 = uVar5;
  }
  lVar2 = -2;
  if ((ushort)uVar1 < 2) {
    lVar2 = -(ulong)uVar1;
  }
  return lVar2 + uVar3;
}

Assistant:

size_t FAST(u16CLZ)(register u16 w)
{
	register size_t l = 16;
	register u16 t;
	if (t = w >> 8)
		l -= 8, w = t;
	if (t = w >> 4)
		l -= 4, w = t;
	if (t = w >> 2)
		l -= 2, w = t;
	t = 0;
	return (w >> 1) ? l - 2 : l - (w ? 1 : 0);
}